

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::FindNextNoneWhiteSpace(XFileParser *this)

{
  int iVar1;
  bool bVar2;
  bool running;
  XFileParser *this_local;
  
  if ((this->mIsBinaryFormat & 1U) == 0) {
    while( true ) {
      while( true ) {
        bVar2 = false;
        if (this->mP < this->mEnd) {
          iVar1 = isspace((uint)(byte)*this->mP);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        if (*this->mP == '\n') {
          this->mLineNumber = this->mLineNumber + 1;
        }
        this->mP = this->mP + 1;
      }
      if ((this->mEnd <= this->mP) ||
         (((*this->mP != '/' || (this->mP[1] != '/')) && (*this->mP != '#')))) break;
      ReadUntilEndOfLine(this);
    }
  }
  return;
}

Assistant:

void XFileParser::FindNextNoneWhiteSpace()
{
    if( mIsBinaryFormat)
        return;

    bool running = true;
    while( running )
    {
        while( mP < mEnd && isspace( (unsigned char) *mP))
        {
            if( *mP == '\n')
                mLineNumber++;
            ++mP;
        }

        if( mP >= mEnd)
            return;

        // check if this is a comment
        if( (mP[0] == '/' && mP[1] == '/') || mP[0] == '#')
            ReadUntilEndOfLine();
        else
            break;
    }
}